

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

bool __thiscall google::protobuf::FileDescriptorSet::IsInitialized(FileDescriptorSet *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  
  uVar4 = (ulong)(uint)(this->file_).super_RepeatedPtrFieldBase.current_size_;
  do {
    iVar3 = (int)uVar4;
    if (iVar3 < 1) break;
    lVar1 = uVar4 - 1;
    uVar4 = uVar4 - 1;
    bVar2 = FileDescriptorProto::IsInitialized
                      ((FileDescriptorProto *)
                       ((this->file_).super_RepeatedPtrFieldBase.rep_)->elements[lVar1]);
  } while (bVar2);
  return iVar3 < 1;
}

Assistant:

bool FileDescriptorSet::IsInitialized() const {
  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(this->file())) return false;
  return true;
}